

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGClipPathElement::applyClipMask(SVGClipPathElement *this,SVGRenderState *state)

{
  SVGClipPathElement *this_00;
  bool bVar1;
  float tx;
  float ty;
  float sx;
  float sy;
  shared_ptr<lunasvg::Canvas> maskImage;
  Transform currentTransform;
  __shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2> local_78;
  SVGRenderState local_68;
  
  bVar1 = SVGRenderState::hasCycleReference(state,(SVGElement *)this);
  if (!bVar1) {
    (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xd])();
    local_68._0_16_ = Transform::mapRect(&state->m_currentTransform,(Rect *)&currentTransform);
    sx = local_68.m_parent._0_4_;
    sy = local_68.m_parent._4_4_;
    Canvas::create((Canvas *)&maskImage,(Rect *)&local_68);
    local_68.m_currentTransform.m_matrix.a =
         *(float *)&(this->super_SVGGraphicsElement).m_transform.field_0x1c;
    local_68.m_currentTransform.m_matrix.b =
         *(float *)&(this->super_SVGGraphicsElement).m_transform.field_0x20;
    local_68._0_16_ =
         *(undefined1 (*) [16])
          &(this->super_SVGGraphicsElement).m_transform.super_SVGProperty.field_0xc;
    Transform::operator*(&currentTransform,&state->m_currentTransform,(Transform *)&local_68);
    if ((this->m_clipPathUnits).super_SVGProperty.field_0x9 == '\x01') {
      (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
      Transform::translate(&currentTransform,tx,ty);
      Transform::scale(&currentTransform,sx,sy);
    }
    std::__shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,&maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>)
    ;
    local_68.m_parent = state;
    local_68.m_element = (SVGElement *)this;
    local_68.m_currentTransform.m_matrix.e = currentTransform.m_matrix.e;
    local_68.m_currentTransform.m_matrix.f = currentTransform.m_matrix.f;
    local_68.m_mode = Clipping;
    local_68.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_78._M_ptr;
    local_68.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_78._M_refcount._M_pi;
    local_78._M_ptr = (element_type *)0x0;
    local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    SVGElement::renderChildren((SVGElement *)this,&local_68);
    this_00 = (this->super_SVGGraphicsElement).super_SVGElement.m_clipper;
    if (this_00 != (SVGClipPathElement *)0x0) {
      applyClipMask(this_00,&local_68);
    }
    Canvas::blendCanvas((state->m_canvas).
                        super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,Dst_In,1.0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_68 + 0x38));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void SVGClipPathElement::applyClipMask(SVGRenderState& state) const
{
    if(state.hasCycleReference(this))
        return;
    auto maskImage = Canvas::create(state.currentTransform().mapRect(state.paintBoundingBox()));
    auto currentTransform = state.currentTransform() * localTransform();
    if(m_clipPathUnits.value() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        currentTransform.translate(bbox.x, bbox.y);
        currentTransform.scale(bbox.w, bbox.h);
    }

    SVGRenderState newState(this, &state, currentTransform, SVGRenderMode::Clipping, maskImage);
    renderChildren(newState);
    if(clipper()) {
        clipper()->applyClipMask(newState);
    }

    state->blendCanvas(*maskImage, BlendMode::Dst_In, 1.f);
}